

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# load_logisim.cpp
# Opt level: O1

bool __thiscall anon_unknown.dwarf_263741::LogisimParser::parse_xml(LogisimParser *this)

{
  CircuitConstruction *pCVar1;
  size_type *psVar2;
  size_type *psVar3;
  long lVar4;
  pointer puVar5;
  _Base_ptr p_Var6;
  pin_id_t *ppVar7;
  __buckets_ptr pp_Var8;
  _Hash_node_base *p_Var9;
  _Hash_node_base **pp_Var10;
  __buckets_ptr pp_Var11;
  _Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<const_unsigned_long,_(anonymous_namespace)::LogisimParser::LogisimConnection>,_false>_>_>
  *p_Var12;
  _Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LogisimParser::Position>,_true>_>_>
  *p_Var13;
  LSimContext *pLVar14;
  _Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<const_unsigned_long,_(anonymous_namespace)::LogisimParser::LogisimConnection>,_false>_>_>
  *this_00;
  _Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LogisimParser::Position>,_true>_>_>
  *this_01;
  bool bVar15;
  bool bVar16;
  int iVar17;
  xml_node *pxVar18;
  ModelCircuit *pMVar19;
  char_t *pcVar20;
  undefined8 uVar21;
  ModelComponent *component;
  mapped_type *pmVar22;
  pin_id_t pVar23;
  vector<unsigned_long,std::allocator<unsigned_long>> *this_02;
  vector<unsigned_long,std::allocator<unsigned_long>> *this_03;
  __normal_iterator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
  __position;
  ModelWire *this_04;
  __node_ptr p_Var24;
  _Hash_node_base *p_Var25;
  __node_base_ptr *pp_Var26;
  _Hash_node_base _Var27;
  _Base_ptr p_Var28;
  __node_ptr p_Var29;
  _Hash_node_base *p_Var30;
  __node_base_ptr *__s;
  __node_base_ptr *pp_Var31;
  ComponentProperties *props;
  __node_base_ptr p_Var32;
  _Hash_node_base _Var33;
  Position *pos;
  Position *pos_00;
  Position *pos_01;
  Position *__args;
  ulong uVar34;
  size_type sVar35;
  LogisimParser *__bkt;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *node;
  _Rb_tree_node_base *p_Var36;
  pin_id_t *ppVar37;
  char *pcVar38;
  iterator iVar39;
  LogisimParser *__n;
  __node_ptr __n_00;
  ulong uVar40;
  unsigned_long *w;
  unsigned_long *__args_00;
  map<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *pmVar41;
  wire_node_t *__range2;
  __node_base_ptr p_Var42;
  _Hash_node_base *p_Var43;
  unsigned_long *point;
  long lVar44;
  initializer_list<unsigned_long> __l;
  undefined1 auVar45 [16];
  xml_node main_node;
  xml_attribute attr_val;
  string prop_val;
  xml_attribute attr_name;
  wire_container_t *__range1;
  xml_node circuit_node;
  xml_node comp;
  xml_attribute attr_loc;
  string comp_type;
  xml_named_node_iterator __end1_1;
  xml_named_node_iterator __begin1_1;
  string prop_name;
  xml_node project_node;
  xml_node name_node;
  xml_attribute attr_name_1;
  xml_node prop;
  string wire_from;
  string comp_loc;
  xml_named_node_iterator __begin1_2;
  string wire_to;
  xml_named_node_iterator __end1_2;
  xml_named_node_iterator __begin1;
  xml_named_node_iterator __end1;
  undefined1 local_348 [8];
  undefined8 uStack_340;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_338;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_328;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_318;
  uint32_t local_308;
  undefined2 local_304;
  uint32_t local_300;
  undefined2 local_2fc;
  undefined2 uStack_2fa;
  int iStack_2f8;
  bool bStack_2f4;
  bool bStack_2f3;
  __node_base_ptr *local_2f0;
  _Rb_tree_node_base *local_2e8;
  ulong local_2e0;
  xml_attribute local_2d8;
  allocator local_2c9;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LogisimParser::Position>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LogisimParser::Position>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  *local_2c8;
  Position local_2c0;
  Position local_2b8;
  __node_base_ptr local_2b0 [2];
  map<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_2a0;
  _Hash_node_base local_298;
  xml_attribute local_290;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LogisimParser::CircuitConstruction>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LogisimParser::CircuitConstruction>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  *local_288;
  __node_base *local_280;
  wire_container_t *local_278;
  _Base_ptr local_270;
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_(anonymous_namespace)::LogisimParser::LogisimConnection>,_std::allocator<std::pair<const_unsigned_long,_(anonymous_namespace)::LogisimParser::LogisimConnection>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *local_268;
  xml_node local_260;
  xml_node local_258;
  xml_attribute local_250;
  string local_248;
  Position local_228;
  _Hash_node_base *p_Stack_220;
  size_type local_218;
  Position local_208;
  ModelCircuit *pMStack_200;
  __node_base_ptr local_1f8;
  undefined1 local_1e8 [32];
  __node_base_ptr *local_1c8;
  __node_base_ptr *local_1c0;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  *local_1b8;
  _Prime_rehash_policy *local_1b0;
  xml_node local_1a8;
  xml_node local_1a0;
  xml_attribute local_198;
  xml_node local_190;
  Position local_188;
  xml_node_struct *pxStack_180;
  _Hash_node_base *local_178;
  xml_node_struct *local_170;
  xml_node_struct *pxStack_168;
  Position local_160;
  undefined1 local_158 [32];
  xml_named_node_iterator local_138;
  Position local_118;
  ModelCircuit *pMStack_110;
  __node_base_ptr local_108;
  Position local_100;
  __node_base _Stack_f8;
  size_type local_f0;
  xml_named_node_iterator local_e8;
  _Prime_rehash_policy *local_c8;
  _Base_ptr local_c0;
  _Base_ptr local_b8;
  _Base_ptr local_b0;
  char_t *local_a8;
  _Base_ptr local_a0;
  xml_named_node_iterator local_98;
  xml_named_node_iterator local_78;
  xml_object_range<pugi::xml_named_node_iterator> local_60;
  
  local_1a8 = pugi::xml_node::child(&this->m_xml_doc->super_xml_node,"project");
  bVar15 = pugi::xml_node::operator!(&local_1a8);
  if (bVar15) {
    bVar15 = false;
  }
  else {
    pugi::xml_node::children(&local_60,&local_1a8,"circuit");
    local_98._name = local_60._begin._name;
    local_98._wrap._root = local_60._begin._wrap._root;
    local_98._parent._root = local_60._begin._parent._root;
    local_78._name = local_60._end._name;
    local_78._wrap._root = local_60._end._wrap._root;
    local_78._parent._root = local_60._end._parent._root;
    bVar15 = pugi::xml_named_node_iterator::operator!=(&local_98,&local_78);
    if (bVar15) {
      pCVar1 = &this->m_context;
      pmVar41 = (this->m_context).m_circuit_ipins;
      local_b0 = (_Base_ptr)((this->m_context).m_circuit_ipins + 1);
      local_268 = &(this->m_context).m_pin_locs._M_h;
      local_2c8 = &(this->m_context).m_ipin_offsets._M_h;
      local_278 = &(this->m_context).m_wires;
      local_1b8 = &(this->m_context).m_tunnels._M_h;
      local_1b0 = &(this->m_context).m_ipin_offsets._M_h._M_rehash_policy;
      local_2f0 = &(this->m_context).m_ipin_offsets._M_h._M_single_bucket;
      local_298._M_nxt = &(this->m_context).m_ipin_offsets._M_h._M_before_begin;
      local_288 = &(this->m_circuits)._M_h;
      local_c8 = &(this->m_circuits)._M_h._M_rehash_policy;
      local_1c8 = &(this->m_circuits)._M_h._M_single_bucket;
      local_280 = &(this->m_circuits)._M_h._M_before_begin;
      local_b8 = (_Base_ptr)&(this->m_context).m_pin_locs._M_h._M_rehash_policy;
      local_1c0 = &(this->m_context).m_pin_locs._M_h._M_single_bucket;
      local_c0 = (_Base_ptr)&(this->m_context).m_pin_locs._M_h._M_before_begin;
      local_2a0 = pmVar41;
      do {
        pxVar18 = pugi::xml_named_node_iterator::operator*(&local_98);
        local_260._root = pxVar18->_root;
        local_1a0 = pugi::xml_node::find_child_by_attribute(&local_260,"a","name","circuit");
        bVar15 = pugi::xml_node::operator!(&local_1a0);
        if (!bVar15) {
          local_348 = (undefined1  [8])pugi::xml_node::attribute(&local_1a0,"val");
          local_a8 = pugi::xml_attribute::value((xml_attribute *)local_348);
          pMVar19 = lsim::ModelCircuitLibrary::create_circuit
                              (&this->m_lsim_context->m_user_library,local_a8,this->m_lsim_context);
          (this->m_context).m_circuit = pMVar19;
          std::
          _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::clear(&pmVar41->_M_t);
          std::
          _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::clear((_Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)local_b0);
          std::
          _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_(anonymous_namespace)::LogisimParser::LogisimConnection>,_std::allocator<std::pair<const_unsigned_long,_(anonymous_namespace)::LogisimParser::LogisimConnection>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::clear(local_268);
          std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LogisimParser::Position>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LogisimParser::Position>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::clear(local_2c8);
          std::
          vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
          ::_M_erase_at_end(local_278,
                            (this->m_context).m_wires.
                            super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
          std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::clear(local_1b8);
          pugi::xml_node::children
                    ((xml_object_range<pugi::xml_named_node_iterator> *)&local_118.field_0,
                     &local_260,"comp");
          local_1f8 = local_108;
          local_208 = local_118;
          pMStack_200 = pMStack_110;
          local_218 = local_f0;
          local_228 = local_100;
          p_Stack_220 = _Stack_f8._M_nxt;
          while( true ) {
            bVar15 = pugi::xml_named_node_iterator::operator!=
                               ((xml_named_node_iterator *)&local_208.field_0,
                                (xml_named_node_iterator *)&local_228.field_0);
            if (!bVar15) break;
            pxVar18 = pugi::xml_named_node_iterator::operator*
                                ((xml_named_node_iterator *)&local_208.field_0);
            local_258._root = pxVar18->_root;
            local_290 = pugi::xml_node::attribute(&local_258,"name");
            bVar15 = pugi::xml_attribute::operator!(&local_290);
            if (!bVar15) {
              pcVar20 = pugi::xml_attribute::value(&local_290);
              std::__cxx11::string::string((string *)&local_248,pcVar20,(allocator *)local_348);
              local_250 = pugi::xml_node::attribute(&local_258,"loc");
              bVar15 = pugi::xml_attribute::operator!(&local_250);
              if (!bVar15) {
                pcVar20 = pugi::xml_attribute::value(&local_250);
                std::__cxx11::string::string((string *)local_158,pcVar20,(allocator *)local_348);
                local_348 = (undefined1  [8])0x0;
                local_338._M_allocated_capacity = 0;
                aStack_328._M_allocated_capacity = (size_type)&local_318;
                aStack_328._8_8_ = 0;
                local_318._M_local_buf[0] = '\0';
                local_304._0_1_ = false;
                local_304._1_1_ = false;
                local_338._8_4_ = LS_EAST;
                uStack_340 = (LSimContext *)CONCAT44((int)((ulong)uStack_340 >> 0x20),2);
                local_308 = 1;
                local_300 = 2;
                local_2fc = 2;
                uStack_2fa = 0;
                iStack_2f8 = -1;
                bStack_2f4 = false;
                bStack_2f3 = false;
                bVar15 = parse_location((LogisimParser *)local_158,(string *)&local_338,pos);
                if (bVar15) {
                  pugi::xml_node::children
                            ((xml_object_range<pugi::xml_named_node_iterator> *)&local_188.field_0,
                             &local_258,"a");
                  local_138._name = (char_t *)local_178;
                  local_138._wrap._root = (xml_node_struct *)local_188;
                  local_138._parent._root = pxStack_180;
                  props = (ComponentProperties *)&local_170;
                  local_e8._name = (char_t *)local_160;
                  local_e8._wrap._root = local_170;
                  local_e8._parent._root = pxStack_168;
                  local_2e8 = (_Rb_tree_node_base *)((ulong)local_2e8 & 0xffffffff00000000);
                  local_270 = (_Base_ptr)CONCAT44(local_270._4_4_,1);
                  local_2e0 = local_2e0 & 0xffffffff00000000;
                  while( true ) {
                    bVar15 = pugi::xml_named_node_iterator::operator!=(&local_138,&local_e8);
                    if (!bVar15) break;
                    pxVar18 = pugi::xml_named_node_iterator::operator*(&local_138);
                    local_190._root = pxVar18->_root;
                    local_198 = pugi::xml_node::attribute(&local_190,"name");
                    bVar16 = pugi::xml_attribute::operator!(&local_198);
                    if (bVar16) {
                      bVar16 = false;
                    }
                    else {
                      pcVar20 = pugi::xml_attribute::value(&local_198);
                      std::__cxx11::string::string
                                ((string *)local_1e8,pcVar20,(allocator *)&local_2c0.field_0);
                      local_2d8 = pugi::xml_node::attribute(&local_190,"val");
                      bVar16 = pugi::xml_attribute::operator!(&local_2d8);
                      if (!bVar16) {
                        pcVar20 = pugi::xml_attribute::value(&local_2d8);
                        std::__cxx11::string::string
                                  ((string *)&local_2c0.field_0,pcVar20,&local_2c9);
                        iVar17 = std::__cxx11::string::compare(local_1e8);
                        if (iVar17 == 0) {
                          std::__cxx11::string::_M_assign((string *)aStack_328._M_local_buf);
                        }
                        else {
                          iVar17 = std::__cxx11::string::compare(local_1e8);
                          if (iVar17 == 0) {
                            iVar17 = pugi::xml_attribute::as_int(&local_2d8,local_348._0_4_);
                            local_348._0_4_ = iVar17;
                          }
                          else {
                            iVar17 = std::__cxx11::string::compare(local_1e8);
                            if (iVar17 == 0) {
                              iVar17 = std::__cxx11::string::compare((char *)&local_2c0.m_full);
                              if (iVar17 == 0) {
                                local_338._8_4_ = LS_NORTH;
                              }
                              else {
                                iVar17 = std::__cxx11::string::compare((char *)&local_2c0.m_full);
                                if (iVar17 == 0) {
                                  local_338._8_4_ = LS_EAST;
                                }
                                else {
                                  iVar17 = std::__cxx11::string::compare((char *)&local_2c0.m_full);
                                  if (iVar17 == 0) {
                                    local_338._8_4_ = LS_SOUTH;
                                  }
                                  else {
                                    iVar17 = std::__cxx11::string::compare
                                                       ((char *)&local_2c0.m_full);
                                    pcVar38 = "Invalid facing \"%s\"";
                                    if (iVar17 == 0) {
                                      local_338._8_4_ = LS_WEST;
                                    }
                                    else {
LAB_001715bb:
                                      error_msg("/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/load_logisim.cpp"
                                                ,pcVar38,local_2c0.m_full);
                                    }
                                  }
                                }
                              }
                            }
                            else {
                              iVar17 = std::__cxx11::string::compare(local_1e8);
                              if (iVar17 == 0) {
                                iVar17 = pugi::xml_attribute::as_int
                                                   (&local_2d8,(uint32_t)uStack_340);
                                uStack_340 = (LSimContext *)CONCAT44(uStack_340._4_4_,iVar17);
                              }
                              else {
                                iVar17 = std::__cxx11::string::compare(local_1e8);
                                if (iVar17 == 0) {
                                  uVar21 = std::__cxx11::string::compare((char *)&local_2c0.m_full);
                                  local_2e8 = (_Rb_tree_node_base *)
                                              CONCAT44(local_2e8._4_4_,
                                                       (int)CONCAT71((int7)((ulong)uVar21 >> 8),
                                                                     (int)uVar21 == 0));
                                }
                                else {
                                  iVar17 = std::__cxx11::string::compare(local_1e8);
                                  if (iVar17 == 0) {
                                    iVar17 = std::__cxx11::string::compare
                                                       ((char *)&local_2c0.m_full);
                                    props = (ComponentProperties *)(ulong)(iVar17 != 0);
                                    local_270 = (_Base_ptr)
                                                CONCAT44(local_270._4_4_,(uint)(iVar17 != 0));
                                  }
                                  else {
                                    iVar17 = std::__cxx11::string::compare(local_1e8);
                                    if (iVar17 == 0) {
                                      iVar17 = std::__cxx11::string::compare
                                                         ((char *)&local_2c0.m_full);
                                      bStack_2f4 = iVar17 == 0;
                                    }
                                    else {
                                      iVar17 = std::__cxx11::string::compare(local_1e8);
                                      if (iVar17 == 0) {
                                        iVar17 = std::__cxx11::string::compare
                                                           ((char *)&local_2c0.m_full);
                                        bStack_2f3 = iVar17 == 0;
                                      }
                                      else {
                                        iVar17 = std::__cxx11::string::compare(local_1e8);
                                        if (iVar17 == 0) {
                                          local_308 = pugi::xml_attribute::as_int
                                                                (&local_2d8,local_308);
                                        }
                                        else {
                                          iVar17 = std::__cxx11::string::compare(local_1e8);
                                          if (iVar17 == 0) {
                                            local_300 = pugi::xml_attribute::as_int(&local_2d8,0);
                                          }
                                          else {
                                            iVar17 = std::__cxx11::string::compare(local_1e8);
                                            if (iVar17 == 0) {
                                              iVar17 = pugi::xml_attribute::as_int(&local_2d8,0);
                                              local_2fc = (undefined2)iVar17;
                                              uStack_2fa = (undefined2)((uint)iVar17 >> 0x10);
                                            }
                                            else {
                                              iVar17 = std::__cxx11::string::compare(local_1e8);
                                              if (iVar17 == 0) {
                                                iVar17 = std::__cxx11::string::compare
                                                                   ((char *)&local_2c0.m_full);
                                                if ((iVar17 == 0) ||
                                                   (iVar17 = std::__cxx11::string::compare
                                                                       ((char *)&local_2c0.m_full),
                                                   iVar17 == 0)) {
                                                  iStack_2f8 = 0;
                                                }
                                                else {
                                                  iVar17 = std::__cxx11::string::compare
                                                                     ((char *)&local_2c0.m_full);
                                                  if (iVar17 == 0) {
                                                    iStack_2f8 = 1;
                                                  }
                                                  else {
                                                    iVar17 = std::__cxx11::string::compare
                                                                       ((char *)&local_2c0.m_full);
                                                    pcVar38 = "Invalid splitter appearance \"%s\"";
                                                    if (iVar17 != 0) goto LAB_001715bb;
                                                    iStack_2f8 = -1;
                                                  }
                                                }
                                              }
                                              else {
                                                iVar17 = std::__cxx11::string::compare(local_1e8);
                                                if (iVar17 == 0) {
                                                  iVar17 = std::__cxx11::string::compare
                                                                     ((char *)&local_2c0.m_full);
                                                  if (iVar17 == 0) {
                                                    local_2e0 = CONCAT44(local_2e0._4_4_,1);
                                                  }
                                                  else {
                                                    iVar17 = std::__cxx11::string::compare
                                                                       ((char *)&local_2c0.m_full);
                                                    props = (ComponentProperties *)
                                                            (ulong)(iVar17 == 0);
                                                    local_2e0 = CONCAT44(local_2e0._4_4_,
                                                                         (uint)(iVar17 == 0) * 3);
                                                  }
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                        if ((__node_base_ptr *)local_2c0.m_full != local_2b0) {
                          operator_delete((void *)local_2c0,(ulong)((long)&local_2b0[0]->_M_nxt + 1)
                                         );
                        }
                      }
                      if ((xml_node_struct *)local_1e8._0_8_ !=
                          (xml_node_struct *)(local_1e8 + 0x10)) {
                        operator_delete((void *)local_1e8._0_8_,(ulong)(local_1e8._16_8_ + 1));
                      }
                      bVar16 = !bVar16;
                    }
                    if (!bVar16) break;
                    pugi::xml_named_node_iterator::operator++(&local_138);
                  }
                  if (!bVar15) {
                    iVar17 = std::__cxx11::string::compare((char *)&local_248);
                    if (iVar17 == 0) {
                      component = lsim::ModelCircuit::add_buffer(pCVar1->m_circuit,local_308);
                      bVar15 = true;
                      handle_buffer(this,component,(ComponentProperties *)local_348,false,false);
                    }
                    else {
                      iVar17 = std::__cxx11::string::compare((char *)&local_248);
                      if (iVar17 == 0) {
                        component = lsim::ModelCircuit::add_tristate_buffer
                                              (pCVar1->m_circuit,local_308);
                        bVar15 = true;
                        handle_buffer(this,component,(ComponentProperties *)local_348,true,
                                      (bool)((byte)local_2e8 & 1));
                      }
                      else {
                        iVar17 = std::__cxx11::string::compare((char *)&local_248);
                        if (iVar17 == 0) {
                          component = lsim::ModelCircuit::add_constant
                                                (pCVar1->m_circuit,(Value)local_270);
                          pVar23 = lsim::ModelComponent::pin_id(component,0);
                          bVar15 = true;
                          add_pin_location(this,(Position *)&local_338,pVar23);
                        }
                        else {
                          iVar17 = std::__cxx11::string::compare((char *)&local_248);
                          if (iVar17 == 0) {
                            if (bStack_2f4 == false) {
                              component = lsim::ModelCircuit::add_connector_in
                                                    (pCVar1->m_circuit,
                                                     (char *)aStack_328._M_allocated_capacity,
                                                     local_308,false);
                            }
                            else {
                              component = lsim::ModelCircuit::add_connector_out
                                                    (pCVar1->m_circuit,
                                                     (char *)aStack_328._M_allocated_capacity,
                                                     local_308,false);
                            }
                            pVar23 = lsim::ModelComponent::pin_id(component,0);
                            add_pin_location(this,(Position *)&local_338,pVar23,
                                             (ulong)(component->m_outputs + component->m_inputs));
                            pmVar22 = std::
                                      map<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                      ::operator[]((
                                                  map<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                                  *)(&(pmVar41->_M_t)._M_impl.field_0x0 +
                                                    (uint)bStack_2f4 * 0x30),
                                                  &local_338._M_allocated_capacity);
                            std::__cxx11::string::_M_assign((string *)pmVar22);
                            bVar15 = true;
                            if (bStack_2f4 == true) {
                              switch(local_338._8_4_) {
                              case 0:
                              case 1:
                              case 2:
                              case 3:
                                local_338._8_4_ = LS_EAST;
                              }
                            }
                          }
                          else {
                            iVar17 = std::__cxx11::string::compare((char *)&local_248);
                            if (iVar17 == 0) {
                              component = lsim::ModelCircuit::add_and_gate
                                                    (pCVar1->m_circuit,(uint32_t)uStack_340);
                              bVar15 = handle_gate(this,component,(ComponentProperties *)local_348);
                            }
                            else {
                              iVar17 = std::__cxx11::string::compare((char *)&local_248);
                              if (iVar17 == 0) {
                                component = lsim::ModelCircuit::add_or_gate
                                                      (pCVar1->m_circuit,(uint32_t)uStack_340);
                                bVar15 = handle_gate(this,component,(ComponentProperties *)local_348
                                                    );
                              }
                              else {
                                iVar17 = std::__cxx11::string::compare((char *)&local_248);
                                if (iVar17 == 0) {
                                  component = lsim::ModelCircuit::add_not_gate(pCVar1->m_circuit);
                                  uStack_340 = (LSimContext *)CONCAT44(uStack_340._4_4_,1);
                                  if (local_308 == 1) {
                                    if (local_348._0_4_ == 0) {
                                      local_348._0_4_ = 0x1e;
                                    }
                                    local_188 = input_pin_location((LogisimParser *)
                                                                   local_338._M_allocated_capacity,
                                                                   (Position)0x0,
                                                                   (uint32_t)
                                                                   (ComponentProperties *)local_348,
                                                                   props);
                                    pVar23 = lsim::ModelComponent::input_pin_id(component,0);
                                    add_pin_location(this,&local_188,pVar23);
                                    pVar23 = lsim::ModelComponent::output_pin_id(component,0);
                                    bVar15 = true;
                                    add_pin_location(this,(Position *)&local_338,pVar23);
                                  }
                                  else {
                                    bVar15 = false;
                                    error_msg("/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/load_logisim.cpp"
                                              ,"%d-bit gates are not supported");
                                  }
                                }
                                else {
                                  iVar17 = std::__cxx11::string::compare((char *)&local_248);
                                  if (iVar17 == 0) {
                                    component = lsim::ModelCircuit::add_nand_gate
                                                          (pCVar1->m_circuit,(uint32_t)uStack_340);
                                    local_304._0_1_ = true;
                                    bVar15 = handle_gate(this,component,
                                                         (ComponentProperties *)local_348);
                                  }
                                  else {
                                    iVar17 = std::__cxx11::string::compare((char *)&local_248);
                                    if (iVar17 == 0) {
                                      component = lsim::ModelCircuit::add_nor_gate
                                                            (pCVar1->m_circuit,(uint32_t)uStack_340)
                                      ;
                                      local_304._0_1_ = true;
                                      bVar15 = handle_gate(this,component,
                                                           (ComponentProperties *)local_348);
                                    }
                                    else {
                                      iVar17 = std::__cxx11::string::compare((char *)&local_248);
                                      if (iVar17 == 0) {
                                        if ((uint32_t)uStack_340 != 2) {
LAB_00171dc4:
                                          error_msg(
                                                  "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/load_logisim.cpp"
                                                  ,"XOR-gates with %d inputs are not supported");
                                          goto LAB_00171d44;
                                        }
                                        component = lsim::ModelCircuit::add_xor_gate
                                                              (pCVar1->m_circuit);
                                        local_348._4_4_ = 10;
                                        bVar15 = handle_gate(this,component,
                                                             (ComponentProperties *)local_348);
                                      }
                                      else {
                                        iVar17 = std::__cxx11::string::compare((char *)&local_248);
                                        if (iVar17 == 0) {
                                          if ((uint32_t)uStack_340 != 2) goto LAB_00171dc4;
                                          component = lsim::ModelCircuit::add_xnor_gate
                                                                (pCVar1->m_circuit);
                                          local_348._4_4_ = 10;
                                          local_304._0_1_ = true;
                                          bVar15 = handle_gate(this,component,
                                                               (ComponentProperties *)local_348);
                                        }
                                        else {
                                          iVar17 = std::__cxx11::string::compare((char *)&local_248)
                                          ;
                                          bVar15 = true;
                                          if (iVar17 != 0) {
                                            iVar17 = std::__cxx11::string::compare
                                                               ((char *)&local_248);
                                            if (iVar17 == 0) {
                                              bVar15 = handle_tunnel(this,(ComponentProperties *)
                                                                          local_348);
                                            }
                                            else {
                                              iVar17 = std::__cxx11::string::compare
                                                                 ((char *)&local_248);
                                              if (iVar17 == 0) {
                                                component = lsim::ModelCircuit::add_pull_resistor
                                                                      (pCVar1->m_circuit,
                                                                       (Value)local_2e0);
                                                pVar23 = lsim::ModelComponent::pin_id(component,0);
                                                add_pin_location(this,(Position *)&local_338,pVar23)
                                                ;
                                                goto switchD_00171b33_default;
                                              }
                                              iVar17 = std::__cxx11::string::compare
                                                                 ((char *)&local_248);
                                              if ((iVar17 != 0) &&
                                                 (iVar17 = std::__cxx11::string::compare
                                                                     ((char *)&local_248),
                                                 iVar17 != 0)) {
                                                component = handle_sub_circuit(this,&local_248,
                                                                               (ComponentProperties
                                                                                *)local_348);
                                                if (component != (ModelComponent *)0x0)
                                                goto switchD_00171b33_default;
                                                bVar15 = false;
                                                error_msg(
                                                  "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/load_logisim.cpp"
                                                  ,"Unsupport component (%s) - loading failed",
                                                  local_248._M_dataplus._M_p);
                                              }
                                            }
                                          }
                                          component = (ModelComponent *)0x0;
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
switchD_00171b33_default:
                    if ((bVar15 != false) && (component != (ModelComponent *)0x0)) {
                      lsim::Point::Point((Point *)&local_188.field_0,
                                         (float)(int)local_338._M_allocated_capacity._4_4_ +
                                         (float)(int)local_338._M_allocated_capacity._4_4_,
                                         (float)(int)local_338._M_allocated_capacity._0_4_ +
                                         (float)(int)local_338._M_allocated_capacity._0_4_);
                      lsim::ModelComponent::set_position(component,(Point *)&local_188.field_0);
                      iVar17 = 0xb4;
                      if ((ulong)(uint)local_338._8_4_ < 3) {
                        iVar17 = *(int *)(&DAT_001ab474 + (ulong)(uint)local_338._8_4_ * 4);
                      }
                      lsim::ModelComponent::set_angle(component,iVar17);
                    }
                  }
                }
LAB_00171d44:
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)aStack_328._M_allocated_capacity != &local_318) {
                  operator_delete((void *)aStack_328._M_allocated_capacity,
                                  CONCAT71(local_318._M_allocated_capacity._1_7_,
                                           local_318._M_local_buf[0]) + 1);
                }
                if ((xml_document *)local_158._0_8_ != (xml_document *)(local_158 + 0x10)) {
                  operator_delete((void *)local_158._0_8_,(ulong)(local_158._16_8_ + 1));
                }
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_248._M_dataplus._M_p != &local_248.field_2) {
                operator_delete(local_248._M_dataplus._M_p,
                                local_248.field_2._M_allocated_capacity + 1);
              }
            }
            pugi::xml_named_node_iterator::operator++((xml_named_node_iterator *)&local_208.field_0)
            ;
          }
          pugi::xml_node::children
                    ((xml_object_range<pugi::xml_named_node_iterator> *)local_348,&local_260,"wire")
          ;
          local_158._16_8_ = local_338._M_allocated_capacity;
          local_158._0_8_ = local_348;
          local_158._8_8_ = uStack_340;
          local_1e8._16_8_ = aStack_328._8_8_;
          local_1e8._0_8_ = CONCAT44(local_338._12_4_,local_338._8_4_);
          local_1e8._8_8_ = aStack_328._M_allocated_capacity;
          bVar15 = pugi::xml_named_node_iterator::operator!=
                             ((xml_named_node_iterator *)local_158,
                              (xml_named_node_iterator *)local_1e8);
          if (bVar15) {
            do {
              pxVar18 = pugi::xml_named_node_iterator::operator*
                                  ((xml_named_node_iterator *)local_158);
              local_290._attr = (xml_attribute_struct *)pxVar18->_root;
              local_138._wrap._root =
                   (xml_node_struct *)pugi::xml_node::attribute((xml_node *)&local_290,"from");
              bVar15 = pugi::xml_attribute::operator!((xml_attribute *)&local_138);
              if (!bVar15) {
                pcVar20 = pugi::xml_attribute::value((xml_attribute *)&local_138);
                std::__cxx11::string::string
                          ((string *)&local_188.field_0,pcVar20,(allocator *)&local_118.field_0);
                local_e8._wrap._root =
                     (xml_node_struct *)pugi::xml_node::attribute((xml_node *)&local_290,"to");
                bVar15 = pugi::xml_attribute::operator!((xml_attribute *)&local_e8);
                if (!bVar15) {
                  pcVar20 = pugi::xml_attribute::value((xml_attribute *)&local_e8);
                  std::__cxx11::string::string
                            ((string *)&local_118.field_0,pcVar20,(allocator *)&local_248);
                  local_208.m_full = 0;
                  local_228.m_full = 0;
                  bVar15 = parse_location((LogisimParser *)&local_188.field_0,
                                          (string *)&local_208.field_0,pos_00);
                  if ((bVar15) &&
                     (bVar15 = parse_location((LogisimParser *)&local_118.field_0,
                                              (string *)&local_228.field_0,pos_01), bVar15)) {
                    this_02 = (vector<unsigned_long,std::allocator<unsigned_long>> *)
                              point_on_wire(this,local_208);
                    this_03 = (vector<unsigned_long,std::allocator<unsigned_long>> *)
                              point_on_wire(this,local_228);
                    if (this_02 == (vector<unsigned_long,std::allocator<unsigned_long>> *)0x0 &&
                        this_03 == (vector<unsigned_long,std::allocator<unsigned_long>> *)0x0) {
                      local_2c0 = local_208;
                      local_2b8 = local_228;
                      __l._M_len = 2;
                      __l._M_array = (iterator)&local_2c0;
                      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_248
                                 ,__l,(allocator_type *)&local_250);
                      std::
                      vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                      ::push_back(local_278,(value_type *)&local_248);
                      if (local_248._M_dataplus._M_p != (pointer)0x0) {
                        operator_delete(local_248._M_dataplus._M_p,
                                        local_248.field_2._M_allocated_capacity -
                                        (long)local_248._M_dataplus._M_p);
                      }
                    }
                    else if (this_03 == (vector<unsigned_long,std::allocator<unsigned_long>> *)0x0
                             || this_02 ==
                                (vector<unsigned_long,std::allocator<unsigned_long>> *)0x0) {
                      if (this_03 == (vector<unsigned_long,std::allocator<unsigned_long>> *)0x0 &&
                          this_02 != (vector<unsigned_long,std::allocator<unsigned_long>> *)0x0) {
                        iVar39._M_current = *(unsigned_long **)(this_02 + 8);
                        if ((Position *)iVar39._M_current == *(Position **)(this_02 + 0x10)) {
                          __args = &local_228;
                          this_03 = this_02;
LAB_0017213a:
                          std::vector<unsigned_long,std::allocator<unsigned_long>>::
                          _M_realloc_insert<unsigned_long_const&>(this_03,iVar39,&__args->m_full);
                        }
                        else {
                          *iVar39._M_current = (unsigned_long)local_228;
                          *(Position **)(this_02 + 8) = (Position *)iVar39._M_current + 1;
                        }
                      }
                      else if (this_02 == (vector<unsigned_long,std::allocator<unsigned_long>> *)0x0
                               && this_03 !=
                                  (vector<unsigned_long,std::allocator<unsigned_long>> *)0x0) {
                        iVar39._M_current = *(unsigned_long **)(this_03 + 8);
                        __args = &local_208;
                        if ((Position *)iVar39._M_current == *(Position **)(this_03 + 0x10))
                        goto LAB_0017213a;
                        *iVar39._M_current = (unsigned_long)local_208;
                        *(Position **)(this_03 + 8) = (Position *)iVar39._M_current + 1;
                      }
                    }
                    else {
                      puVar5 = *(pointer *)(this_03 + 8);
                      for (__args_00 = *(unsigned_long **)this_03; __args_00 != puVar5;
                          __args_00 = __args_00 + 1) {
                        iVar39._M_current = *(unsigned_long **)(this_02 + 8);
                        if (iVar39._M_current == *(unsigned_long **)(this_02 + 0x10)) {
                          std::vector<unsigned_long,std::allocator<unsigned_long>>::
                          _M_realloc_insert<unsigned_long_const&>(this_02,iVar39,__args_00);
                        }
                        else {
                          *iVar39._M_current = *__args_00;
                          *(unsigned_long **)(this_02 + 8) = iVar39._M_current + 1;
                        }
                      }
                      if (*(pointer *)(this_03 + 8) != *(pointer *)this_03) {
                        *(pointer *)(this_03 + 8) = *(pointer *)this_03;
                      }
                      __position = std::
                                   __find_if<__gnu_cxx::__normal_iterator<std::vector<unsigned_long,std::allocator<unsigned_long>>*,std::vector<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::allocator<std::vector<unsigned_long,std::allocator<unsigned_long>>>>>,__gnu_cxx::__ops::_Iter_equals_val<std::vector<unsigned_long,std::allocator<unsigned_long>>const>>
                                             ((this->m_context).m_wires.
                                              super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_start,
                                              (this->m_context).m_wires.
                                              super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_finish,this_03);
                      std::
                      vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                      ::_M_erase(local_278,(iterator)__position._M_current);
                    }
                  }
                  if ((__node_base_ptr *)local_118.m_full != &local_108) {
                    operator_delete((void *)local_118,(ulong)((long)&local_108->_M_nxt + 1));
                  }
                }
                if ((_Hash_node_base **)local_188.m_full != &local_178) {
                  operator_delete((void *)local_188,(ulong)((long)&local_178->_M_nxt + 1));
                }
              }
              pugi::xml_named_node_iterator::operator++((xml_named_node_iterator *)local_158);
              bVar15 = pugi::xml_named_node_iterator::operator!=
                                 ((xml_named_node_iterator *)local_158,
                                  (xml_named_node_iterator *)local_1e8);
            } while (bVar15);
          }
          p_Var36 = (_Rb_tree_node_base *)
                    (this->m_context).m_wires.
                    super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          local_2e8 = (_Rb_tree_node_base *)
                      (this->m_context).m_wires.
                      super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
          if (p_Var36 != local_2e8) {
            do {
              this_04 = lsim::ModelCircuit::create_wire(pCVar1->m_circuit);
              p_Var6 = p_Var36->_M_parent;
              for (p_Var28 = *(_Base_ptr *)p_Var36; p_Var28 != p_Var6;
                  p_Var28 = (_Base_ptr)&p_Var28->_M_parent) {
                p_Var24 = std::
                          _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_(anonymous_namespace)::LogisimParser::LogisimConnection>,_std::allocator<std::pair<const_unsigned_long,_(anonymous_namespace)::LogisimParser::LogisimConnection>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                          ::_M_find_node(local_268,
                                         *(ulong *)p_Var28 %
                                         (this->m_context).m_pin_locs._M_h._M_bucket_count,
                                         (key_type_conflict *)p_Var28,(__hash_code)this);
                if (p_Var24 != (__node_ptr)0x0) {
                  ppVar7 = *(pin_id_t **)
                            ((long)&(p_Var24->
                                    super__Hash_node_value<std::pair<const_unsigned_long,_(anonymous_namespace)::LogisimParser::LogisimConnection>,_false>
                                    ).
                                    super__Hash_node_value_base<std::pair<const_unsigned_long,_(anonymous_namespace)::LogisimParser::LogisimConnection>_>
                                    ._M_storage._M_storage + 0x18);
                  for (ppVar37 = *(pin_id_t **)
                                  ((long)&(p_Var24->
                                          super__Hash_node_value<std::pair<const_unsigned_long,_(anonymous_namespace)::LogisimParser::LogisimConnection>,_false>
                                          ).
                                          super__Hash_node_value_base<std::pair<const_unsigned_long,_(anonymous_namespace)::LogisimParser::LogisimConnection>_>
                                          ._M_storage._M_storage + 0x10); ppVar37 != ppVar7;
                      ppVar37 = ppVar37 + 1) {
                    lsim::ModelWire::add_pin(this_04,*ppVar37);
                  }
                }
              }
              if ((this_04->m_pins).
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_finish ==
                  (this_04->m_pins).
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_start) {
                lsim::ModelCircuit::remove_wire(pCVar1->m_circuit,this_04->m_id);
              }
              p_Var36 = (_Rb_tree_node_base *)&p_Var36->_M_right;
            } while (p_Var36 != local_2e8);
          }
          local_348 = (undefined1  [8])0xffffff2400000000;
          uStack_340 = (LSimContext *)0x0;
          pp_Var26 = local_2f0;
          uVar40 = 0;
          pmVar41 = local_2a0;
          do {
            local_a0 = &pmVar41[uVar40]._M_t._M_impl.super__Rb_tree_header._M_header;
            p_Var28 = pmVar41[uVar40]._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
            local_2e0 = uVar40;
            if (p_Var28 != local_a0) {
              do {
                local_2e8 = p_Var28;
                p_Var25 = (_Hash_node_base *)
                          std::
                          hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          ::operator()((hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                        *)local_2c8,(string *)&p_Var28[1]._M_parent);
                uVar40 = (this->m_context).m_ipin_offsets._M_h._M_bucket_count;
                uVar34 = (ulong)p_Var25 % uVar40;
                p_Var42 = (this->m_context).m_ipin_offsets._M_h._M_buckets[uVar34];
                p_Var32 = (__node_base_ptr)0x0;
                if (p_Var42 != (__node_base_ptr)0x0) {
                  local_270 = local_2e8[1]._M_parent;
                  p_Var28 = local_2e8[1]._M_left;
                  p_Var30 = p_Var42->_M_nxt;
                  do {
                    p_Var32 = p_Var42;
                    p_Var42 = p_Var30;
                    if (((p_Var42[6]._M_nxt == p_Var25) && (p_Var28 == (_Base_ptr)p_Var42[2]._M_nxt)
                        ) && ((p_Var28 == (_Base_ptr)0x0 ||
                              (iVar17 = bcmp(local_270,p_Var42[1]._M_nxt,(size_t)p_Var28),
                              iVar17 == 0)))) break;
                    p_Var30 = p_Var42->_M_nxt;
                    if (p_Var30 == (_Hash_node_base *)0x0) {
                      p_Var32 = (__node_base_ptr)0x0;
                      break;
                    }
                    p_Var32 = (__node_base_ptr)0x0;
                  } while ((ulong)p_Var30[6]._M_nxt % uVar40 == uVar34);
                }
                if (p_Var32 == (__node_base_ptr)0x0) {
                  p_Var30 = (_Hash_node_base *)0x0;
                }
                else {
                  p_Var30 = p_Var32->_M_nxt;
                }
                if (p_Var30 == (_Hash_node_base *)0x0) {
                  p_Var30 = (_Hash_node_base *)operator_new(0x38);
                  p_Var30->_M_nxt = (_Hash_node_base *)0x0;
                  p_Var30[1]._M_nxt = p_Var30 + 3;
                  std::__cxx11::string::_M_construct<char*>
                            ((string *)(p_Var30 + 1),local_2e8[1]._M_parent,
                             (long)&(local_2e8[1]._M_parent)->_M_color +
                             (long)&(local_2e8[1]._M_left)->_M_color);
                  p_Var30[5]._M_nxt = (_Hash_node_base *)0x0;
                  auVar45 = std::__detail::_Prime_rehash_policy::_M_need_rehash
                                      ((ulong)local_1b0,
                                       (this->m_context).m_ipin_offsets._M_h._M_bucket_count,
                                       (this->m_context).m_ipin_offsets._M_h._M_element_count);
                  sVar35 = auVar45._8_8_;
                  if ((auVar45 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                    if (sVar35 == 1) {
                      *local_2f0 = (_Hash_node_base *)0x0;
                      pp_Var26 = local_2f0;
                    }
                    else {
                      pp_Var26 = __gnu_cxx::new_allocator<std::__detail::_Hash_node_base_*>::
                                 allocate((new_allocator<std::__detail::_Hash_node_base_*> *)
                                          &local_188.field_0,sVar35,(void *)0x0);
                      memset(pp_Var26,0,sVar35 * 8);
                    }
                    _Var33._M_nxt = (local_298._M_nxt)->_M_nxt;
                    (local_298._M_nxt)->_M_nxt = (_Hash_node_base *)0x0;
                    if (_Var33._M_nxt != (_Hash_node_base *)0x0) {
                      uVar40 = 0;
                      do {
                        p_Var43 = (_Var33._M_nxt)->_M_nxt;
                        uVar34 = (ulong)_Var33._M_nxt[6]._M_nxt % sVar35;
                        if (pp_Var26[uVar34] == (_Hash_node_base *)0x0) {
                          (_Var33._M_nxt)->_M_nxt = (local_298._M_nxt)->_M_nxt;
                          (local_298._M_nxt)->_M_nxt = _Var33._M_nxt;
                          pp_Var26[uVar34] = local_298._M_nxt;
                          if ((_Var33._M_nxt)->_M_nxt != (_Hash_node_base *)0x0) {
                            _Var27._M_nxt = (_Hash_node_base *)(pp_Var26 + uVar40);
                            goto LAB_001724a0;
                          }
                        }
                        else {
                          (_Var33._M_nxt)->_M_nxt = pp_Var26[uVar34]->_M_nxt;
                          _Var27._M_nxt = pp_Var26[uVar34];
                          uVar34 = uVar40;
LAB_001724a0:
                          *_Var27._M_nxt = (_Hash_node_base)_Var33._M_nxt;
                        }
                        _Var33._M_nxt = p_Var43;
                        uVar40 = uVar34;
                      } while (p_Var43 != (_Hash_node_base *)0x0);
                    }
                    p_Var43 = (_Hash_node_base *)((_Hashtable *)&local_2c8->_M_buckets)->_M_buckets;
                    if ((_Hash_node_base *)local_2f0 != p_Var43) {
                      operator_delete(p_Var43,(this->m_context).m_ipin_offsets._M_h._M_bucket_count
                                              << 3);
                    }
                    (this->m_context).m_ipin_offsets._M_h._M_bucket_count = sVar35;
                    (this->m_context).m_ipin_offsets._M_h._M_buckets = pp_Var26;
                    uVar34 = (ulong)p_Var25 % sVar35;
                  }
                  p_Var30[6]._M_nxt = p_Var25;
                  pp_Var8 = ((_Hashtable *)&local_2c8->_M_buckets)->_M_buckets;
                  if (pp_Var8[uVar34] == (__node_base_ptr)0x0) {
                    p_Var25 = (local_298._M_nxt)->_M_nxt;
                    p_Var30->_M_nxt = p_Var25;
                    (local_298._M_nxt)->_M_nxt = p_Var30;
                    if (p_Var25 != (_Hash_node_base *)0x0) {
                      pp_Var8[(ulong)p_Var25[6]._M_nxt %
                              (this->m_context).m_ipin_offsets._M_h._M_bucket_count] = p_Var30;
                    }
                    ((_Hashtable *)&local_2c8->_M_buckets)->_M_buckets[uVar34] = local_298._M_nxt;
                  }
                  else {
                    p_Var30->_M_nxt = pp_Var8[uVar34]->_M_nxt;
                    pp_Var8[uVar34]->_M_nxt = p_Var30;
                  }
                  psVar3 = &(this->m_context).m_ipin_offsets._M_h._M_element_count;
                  *psVar3 = *psVar3 + 1;
                }
                pmVar41 = local_2a0;
                uVar40 = local_2e0;
                pp_Var26 = local_2f0;
                p_Var30[5]._M_nxt = *(_Hash_node_base **)(local_348 + local_2e0 * 8);
                *(int *)(local_348 + local_2e0 * 8) = *(int *)(local_348 + local_2e0 * 8) + 0x14;
                p_Var28 = (_Base_ptr)std::_Rb_tree_increment(local_2e8);
              } while (p_Var28 != local_a0);
            }
            bVar15 = uVar40 == 0;
            uVar40 = uVar40 + 1;
          } while (bVar15);
          std::__cxx11::string::string((string *)local_348,local_a8,(allocator *)&local_118.field_0)
          ;
          p_Var25 = (_Hash_node_base *)
                    std::_Hash_bytes((void *)local_348,(ulong)uStack_340,0xc70f6907);
          __bkt = (LogisimParser *)((ulong)p_Var25 % (this->m_circuits)._M_h._M_bucket_count);
          __n = __bkt;
          p_Var29 = std::
                    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LogisimParser::CircuitConstruction>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LogisimParser::CircuitConstruction>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                    ::_M_find_node(local_288,(size_type)__bkt,(key_type *)local_348,
                                   (__hash_code)p_Var25);
          if (p_Var29 == (__node_ptr)0x0) {
            p_Var30 = (_Hash_node_base *)operator_new(0x158);
            p_Var30->_M_nxt = (_Hash_node_base *)0x0;
            p_Var30[1]._M_nxt = p_Var30 + 3;
            if (local_348 == (undefined1  [8])&local_338) {
              p_Var30[3]._M_nxt = (_Hash_node_base *)local_338._M_allocated_capacity;
              p_Var30[4]._M_nxt = (_Hash_node_base *)CONCAT44(local_338._12_4_,local_338._8_4_);
            }
            else {
              p_Var30[1]._M_nxt = (_Hash_node_base *)local_348;
              ((Position *)(p_Var30 + 3))->m_full = local_338._M_allocated_capacity;
            }
            p_Var30[2]._M_nxt = (_Hash_node_base *)uStack_340;
            uStack_340 = (LSimContext *)0x0;
            local_338._M_allocated_capacity = local_338._M_allocated_capacity & 0xffffffffffffff00;
            p_Var43 = p_Var30 + 5;
            local_348 = (undefined1  [8])&local_338;
            memset(p_Var43,0,0x128);
            p_Var30[6]._M_nxt = p_Var30 + 0xc;
            p_Var30[7]._M_nxt = (_Hash_node_base *)0x1;
            p_Var30[8]._M_nxt = (_Hash_node_base *)0x0;
            p_Var30[9]._M_nxt = (_Hash_node_base *)0x0;
            *(undefined4 *)&p_Var30[10]._M_nxt = 0x3f800000;
            p_Var30[0xb]._M_nxt = (_Hash_node_base *)0x0;
            p_Var30[0xc]._M_nxt = (_Hash_node_base *)0x0;
            lVar44 = 0x70;
            do {
              lVar4 = (long)&p_Var30->_M_nxt + lVar44;
              *(undefined4 *)((long)&p_Var30->_M_nxt + lVar44) = 0;
              *(undefined8 *)((long)&p_Var30[1]._M_nxt + lVar44) = 0;
              *(long *)((long)&p_Var30[2]._M_nxt + lVar44) = lVar4;
              *(long *)((long)&p_Var30[3]._M_nxt + lVar44) = lVar4;
              *(undefined8 *)((long)&p_Var30[4]._M_nxt + lVar44) = 0;
              lVar44 = lVar44 + 0x30;
            } while (lVar44 != 0xd0);
            p_Var30[0x19]._M_nxt = p_Var30 + 0x1f;
            p_Var30[0x1a]._M_nxt = (_Hash_node_base *)0x1;
            p_Var30[0x1b]._M_nxt = (_Hash_node_base *)0x0;
            p_Var30[0x1c]._M_nxt = (_Hash_node_base *)0x0;
            *(undefined4 *)&p_Var30[0x1d]._M_nxt = 0x3f800000;
            p_Var30[0x1e]._M_nxt = (_Hash_node_base *)0x0;
            p_Var30[0x1f]._M_nxt = (_Hash_node_base *)0x0;
            p_Var30[0x20]._M_nxt = (_Hash_node_base *)0x0;
            p_Var30[0x21]._M_nxt = (_Hash_node_base *)0x0;
            p_Var30[0x22]._M_nxt = (_Hash_node_base *)0x0;
            p_Var30[0x23]._M_nxt = p_Var30 + 0x29;
            p_Var30[0x24]._M_nxt = (_Hash_node_base *)0x1;
            p_Var30[0x25]._M_nxt = (_Hash_node_base *)0x0;
            p_Var30[0x26]._M_nxt = (_Hash_node_base *)0x0;
            *(undefined4 *)&p_Var30[0x27]._M_nxt = 0x3f800000;
            p_Var30[0x28]._M_nxt = (_Hash_node_base *)0x0;
            p_Var30[0x29]._M_nxt = (_Hash_node_base *)0x0;
            auVar45 = std::__detail::_Prime_rehash_policy::_M_need_rehash
                                ((ulong)local_c8,(this->m_circuits)._M_h._M_bucket_count,
                                 (this->m_circuits)._M_h._M_element_count);
            sVar35 = auVar45._8_8_;
            if ((auVar45 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              if (sVar35 == 1) {
                *local_1c8 = (_Hash_node_base *)0x0;
                __s = local_1c8;
              }
              else {
                __s = __gnu_cxx::new_allocator<std::__detail::_Hash_node_base_*>::allocate
                                ((new_allocator<std::__detail::_Hash_node_base_*> *)
                                 &local_188.field_0,sVar35,(void *)0x0);
                memset(__s,0,sVar35 * 8);
              }
              _Var33._M_nxt = local_280->_M_nxt;
              local_280->_M_nxt = (_Hash_node_base *)0x0;
              if (_Var33._M_nxt != (_Hash_node_base *)0x0) {
                uVar40 = 0;
                do {
                  p_Var9 = (_Var33._M_nxt)->_M_nxt;
                  uVar34 = (ulong)_Var33._M_nxt[0x2a]._M_nxt % sVar35;
                  if (__s[uVar34] == (_Hash_node_base *)0x0) {
                    (_Var33._M_nxt)->_M_nxt = local_280->_M_nxt;
                    local_280->_M_nxt = _Var33._M_nxt;
                    __s[uVar34] = local_280;
                    if ((_Var33._M_nxt)->_M_nxt != (_Hash_node_base *)0x0) {
                      pp_Var31 = __s + uVar40;
                      goto LAB_00172844;
                    }
                  }
                  else {
                    (_Var33._M_nxt)->_M_nxt = __s[uVar34]->_M_nxt;
                    pp_Var31 = &__s[uVar34]->_M_nxt;
                    uVar34 = uVar40;
LAB_00172844:
                    *pp_Var31 = _Var33._M_nxt;
                  }
                  _Var33._M_nxt = p_Var9;
                  uVar40 = uVar34;
                } while (p_Var9 != (_Hash_node_base *)0x0);
              }
              pp_Var10 = ((_Hashtable *)&local_288->_M_buckets)->_M_buckets;
              if (local_1c8 != pp_Var10) {
                operator_delete(pp_Var10,(this->m_circuits)._M_h._M_bucket_count << 3);
              }
              (this->m_circuits)._M_h._M_bucket_count = sVar35;
              (this->m_circuits)._M_h._M_buckets = __s;
              __bkt = (LogisimParser *)((ulong)p_Var25 % sVar35);
            }
            p_Var30[0x2a]._M_nxt = p_Var25;
            pp_Var11 = ((_Hashtable *)&local_288->_M_buckets)->_M_buckets;
            if (pp_Var11[(long)__bkt] == (__node_base_ptr)0x0) {
              p_Var25 = local_280->_M_nxt;
              p_Var30->_M_nxt = p_Var25;
              local_280->_M_nxt = p_Var30;
              if (p_Var25 != (_Hash_node_base *)0x0) {
                pp_Var11[(ulong)p_Var25[0x2a]._M_nxt % (this->m_circuits)._M_h._M_bucket_count] =
                     p_Var30;
              }
              ((_Hashtable *)&local_288->_M_buckets)->_M_buckets[(long)__bkt] = local_280;
            }
            else {
              p_Var30->_M_nxt = pp_Var11[(long)__bkt]->_M_nxt;
              pp_Var11[(long)__bkt]->_M_nxt = p_Var30;
            }
            psVar2 = &(this->m_circuits)._M_h._M_element_count;
            *psVar2 = *psVar2 + 1;
            pp_Var26 = local_2f0;
            __n = this;
          }
          else {
            p_Var43 = (_Hash_node_base *)
                      ((long)&(p_Var29->
                              super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LogisimParser::CircuitConstruction>,_true>
                              ).
                              super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LogisimParser::CircuitConstruction>_>
                              ._M_storage._M_storage + 0x20);
          }
          pmVar41 = local_2a0;
          p_Var43->_M_nxt = (_Hash_node_base *)pCVar1->m_circuit;
          if (pCVar1 != (CircuitConstruction *)p_Var43) {
            this_00 = (_Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<const_unsigned_long,_(anonymous_namespace)::LogisimParser::LogisimConnection>,_false>_>_>
                       *)p_Var43[3]._M_nxt;
            while (this_00 !=
                   (_Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<const_unsigned_long,_(anonymous_namespace)::LogisimParser::LogisimConnection>,_false>_>_>
                    *)0x0) {
              p_Var12 = *(_Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<const_unsigned_long,_(anonymous_namespace)::LogisimParser::LogisimConnection>,_false>_>_>
                          **)this_00;
              std::__detail::
              _Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<const_unsigned_long,_(anonymous_namespace)::LogisimParser::LogisimConnection>,_false>_>_>
              ::_M_deallocate_node(this_00,(__node_ptr)__n);
              this_00 = p_Var12;
            }
            if (p_Var43 + 7 != p_Var43[1]._M_nxt) {
              operator_delete(p_Var43[1]._M_nxt,(long)p_Var43[2]._M_nxt << 3);
            }
            p_Var28 = local_b8->_M_parent;
            p_Var43[5]._M_nxt = *(_Hash_node_base **)&local_b8->_M_color;
            p_Var43[6]._M_nxt = (_Hash_node_base *)p_Var28;
            p_Var25 = (_Hash_node_base *)((_Hashtable *)&local_268->_M_buckets)->_M_buckets;
            if ((_Hash_node_base *)local_1c0 == p_Var25) {
              p_Var43[1]._M_nxt = p_Var43 + 7;
              p_Var43[7]._M_nxt = *local_1c0;
            }
            else {
              p_Var43[1]._M_nxt = p_Var25;
            }
            p_Var25 = (_Hash_node_base *)(this->m_context).m_pin_locs._M_h._M_bucket_count;
            p_Var43[2]._M_nxt = p_Var25;
            p_Var30 = (this->m_context).m_pin_locs._M_h._M_before_begin._M_nxt;
            p_Var43[3]._M_nxt = p_Var30;
            p_Var43[4]._M_nxt =
                 (_Hash_node_base *)(this->m_context).m_pin_locs._M_h._M_element_count;
            if (p_Var30 != (_Hash_node_base *)0x0) {
              p_Var43[1]._M_nxt[(ulong)p_Var30[1]._M_nxt % (ulong)p_Var25]._M_nxt = p_Var43 + 3;
            }
            (this->m_context).m_pin_locs._M_h._M_rehash_policy._M_next_resize = 0;
            (this->m_context).m_pin_locs._M_h._M_single_bucket = (__node_base_ptr)0x0;
            (this->m_context).m_pin_locs._M_h._M_bucket_count = 1;
            (this->m_context).m_pin_locs._M_h._M_buckets = local_1c0;
            *(_Hash_node_base **)local_c0 = (_Hash_node_base *)0x0;
            local_c0->_M_parent = (_Base_ptr)0x0;
          }
          lVar44 = 0;
          do {
            __n_00 = (__node_ptr)(&(pmVar41->_M_t)._M_impl.field_0x0 + lVar44);
            std::
            map<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator=((map<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)((long)&p_Var43[8]._M_nxt + lVar44),
                        (map<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)__n_00);
            lVar44 = lVar44 + 0x30;
          } while (lVar44 != 0x60);
          if (pCVar1 != (CircuitConstruction *)p_Var43) {
            this_01 = (_Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LogisimParser::Position>,_true>_>_>
                       *)p_Var43[0x16]._M_nxt;
            while (this_01 !=
                   (_Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LogisimParser::Position>,_true>_>_>
                    *)0x0) {
              p_Var13 = *(_Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LogisimParser::Position>,_true>_>_>
                          **)this_01;
              std::__detail::
              _Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LogisimParser::Position>,_true>_>_>
              ::_M_deallocate_node(this_01,__n_00);
              this_01 = p_Var13;
            }
            if (p_Var43 + 0x1a != p_Var43[0x14]._M_nxt) {
              operator_delete(p_Var43[0x14]._M_nxt,(long)p_Var43[0x15]._M_nxt << 3);
            }
            p_Var25 = (_Hash_node_base *)local_1b0->_M_next_resize;
            p_Var43[0x18]._M_nxt = *(_Hash_node_base **)local_1b0;
            p_Var43[0x19]._M_nxt = p_Var25;
            p_Var25 = (_Hash_node_base *)((_Hashtable *)&local_2c8->_M_buckets)->_M_buckets;
            if ((_Hash_node_base *)pp_Var26 == p_Var25) {
              p_Var43[0x14]._M_nxt = p_Var43 + 0x1a;
              p_Var43[0x1a]._M_nxt = *pp_Var26;
            }
            else {
              p_Var43[0x14]._M_nxt = p_Var25;
            }
            p_Var25 = (_Hash_node_base *)(this->m_context).m_ipin_offsets._M_h._M_bucket_count;
            p_Var43[0x15]._M_nxt = p_Var25;
            p_Var30 = (this->m_context).m_ipin_offsets._M_h._M_before_begin._M_nxt;
            p_Var43[0x16]._M_nxt = p_Var30;
            p_Var43[0x17]._M_nxt =
                 (_Hash_node_base *)(this->m_context).m_ipin_offsets._M_h._M_element_count;
            if (p_Var30 != (_Hash_node_base *)0x0) {
              p_Var43[0x14]._M_nxt[(ulong)p_Var30[6]._M_nxt % (ulong)p_Var25]._M_nxt =
                   p_Var43 + 0x16;
            }
            (this->m_context).m_ipin_offsets._M_h._M_rehash_policy._M_next_resize = 0;
            (this->m_context).m_ipin_offsets._M_h._M_single_bucket = (__node_base_ptr)0x0;
            (this->m_context).m_ipin_offsets._M_h._M_bucket_count = 1;
            (this->m_context).m_ipin_offsets._M_h._M_buckets = pp_Var26;
            (local_298._M_nxt)->_M_nxt = (_Hash_node_base *)0x0;
            local_298._M_nxt[1] = (_Hash_node_base *)0x0;
          }
          std::
          vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
          ::_M_move_assign((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                            *)(p_Var43 + 0x1b),local_278);
          std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::_M_move_assign((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                            *)(p_Var43 + 0x1e),local_1b8);
          if (local_348 != (undefined1  [8])&local_338) {
            operator_delete((void *)local_348,(ulong)(local_338._M_allocated_capacity + 1));
          }
        }
        pugi::xml_named_node_iterator::operator++(&local_98);
        bVar15 = pugi::xml_named_node_iterator::operator!=(&local_98,&local_78);
      } while (bVar15);
    }
    local_348 = (undefined1  [8])pugi::xml_node::child(&local_1a8,"main");
    bVar15 = pugi::xml_node::operator!((xml_node *)local_348);
    if (!bVar15) {
      local_188.field_0 =
           (anon_struct_8_2_43e46ec4_for_Position_0)
           pugi::xml_node::attribute((xml_node *)local_348,"name");
      pcVar20 = pugi::xml_attribute::value((xml_attribute *)&local_188.field_0);
      pLVar14 = this->m_lsim_context;
      pcVar38 = (char *)(pLVar14->m_user_library).m_main_circuit._M_string_length;
      strlen(pcVar20);
      std::__cxx11::string::_M_replace
                ((ulong)&(pLVar14->m_user_library).m_main_circuit,0,pcVar38,(ulong)pcVar20);
    }
    bVar15 = !bVar15;
  }
  return bVar15;
}

Assistant:

bool LogisimParser::parse_xml() {

    auto project_node = m_xml_doc->child("project");
    if (!project_node) {
        return false;
    }

    /* iterate all circuits */
    for (auto circuit_node : project_node.children("circuit")) {
        parse_circuit(circuit_node);
    }

    /* get main circuit */
    auto main_node = project_node.child("main");
    if (!main_node) {
        return false;
    }

    auto main_circuit = main_node.attribute("name").value();
    m_lsim_context->user_library()->change_main_circuit(main_circuit);
    return true;
}